

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

SourceCodeInfo_Location * __thiscall
google::protobuf::FileDescriptorTables::GetSourceLocation
          (FileDescriptorTables *this,vector<int,_std::allocator<int>_> *path,SourceCodeInfo *info)

{
  second_type pSVar1;
  SourceCodeInfo **in_RDI;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*> p;
  once_flag *in_stack_ffffffffffffff80;
  first_type *key;
  string *collection;
  string local_58 [8];
  char *in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  
  std::
  make_pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*&>
            ((FileDescriptorTables **)in_stack_ffffffffffffff80,in_RDI);
  internal::
  call_once<std::once_flag&,void(&)(std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*),std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*>
            (in_stack_ffffffffffffff80,
             (_func_void_pair<const_google::protobuf::FileDescriptorTables_ptr,_const_google::protobuf::SourceCodeInfo_ptr>_ptr
              *)in_RDI,
             (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
              **)0x4b29e9);
  key = (first_type *)(in_RDI + 0x2f);
  collection = local_58;
  Join<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  pSVar1 = FindPtrOrNull<std::unordered_map<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>>
                     ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
                       *)collection,key);
  std::__cxx11::string::~string(local_58);
  return pSVar1;
}

Assistant:

const SourceCodeInfo_Location* FileDescriptorTables::GetSourceLocation(
    const std::vector<int>& path, const SourceCodeInfo* info) const {
  std::pair<const FileDescriptorTables*, const SourceCodeInfo*> p(
      std::make_pair(this, info));
  internal::call_once(locations_by_path_once_,
                      FileDescriptorTables::BuildLocationsByPath, &p);
  return FindPtrOrNull(locations_by_path_, Join(path, ","));
}